

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

_Bool cf_he_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  _Bool _Var6;
  long lVar7;
  
  if ((cf->field_0x24 & 1) != 0) {
    _Var6 = (*cf->next->cft->has_data_pending)(cf->next,data);
    return _Var6;
  }
  pvVar1 = cf->ctx;
  lVar7 = 0;
  bVar4 = true;
  do {
    while ((bVar3 = bVar4, lVar7 = *(long *)((long)pvVar1 + lVar7 * 8 + 0x20), lVar7 == 0 ||
           (plVar2 = *(long **)(lVar7 + 0x28), plVar2 == (long *)0x0))) {
      lVar7 = 1;
      bVar4 = false;
      if (!bVar3) {
        return false;
      }
    }
    cVar5 = (**(code **)(*plVar2 + 0x40))(plVar2,data);
    if (cVar5 != '\0') {
      return (_Bool)cVar5;
    }
    lVar7 = 1;
    bVar4 = false;
  } while (bVar3);
  return false;
}

Assistant:

static bool cf_he_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  if(cf->connected)
    return cf->next->cft->has_data_pending(cf->next, data);

  for(i = 0; i < CURL_ARRAYSIZE(ctx->baller); i++) {
    struct eyeballer *baller = ctx->baller[i];
    if(!baller || !baller->cf)
      continue;
    if(baller->cf->cft->has_data_pending(baller->cf, data))
      return TRUE;
  }
  return FALSE;
}